

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void jtransform_execute_transform
               (j_decompress_ptr srcinfo,j_compress_ptr dstinfo,jvirt_barray_ptr *src_coef_arrays,
               jpeg_transform_info *info)

{
  int iVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  JDIMENSION JVar4;
  jvirt_barray_ptr *ppjVar5;
  JBLOCKROW paJVar6;
  j_decompress_ptr pjVar7;
  jpeg_component_info *pjVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  short sVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  JBLOCKARRAY ppaJVar21;
  JBLOCKARRAY ppaJVar22;
  jpeg_memory_mgr *pjVar23;
  uint uVar24;
  uint uVar25;
  JBLOCKROW paJVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  JCOEF *pJVar33;
  ulong uVar34;
  jvirt_barray_ptr pjVar35;
  uint uVar36;
  uint uVar37;
  ulong uVar38;
  JCOEF *pJVar39;
  uint uVar40;
  int iVar41;
  int iVar42;
  long lVar43;
  JCOEF *pJVar44;
  long lVar45;
  long lVar46;
  JDIMENSION JVar47;
  uint uVar48;
  ulong uVar49;
  JDIMENSION JVar50;
  uint uVar51;
  ulong uVar52;
  bool bVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  int iVar69;
  int iVar71;
  undefined1 auVar70 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 in_XMM5 [16];
  undefined1 auVar74 [16];
  long local_f8;
  long local_e8;
  long local_e0;
  uint local_98;
  int iStack_94;
  int iStack_90;
  int iStack_8c;
  long local_78;
  uint local_5c;
  
  if (JXFORM_DROP < info->transform) {
    return;
  }
  ppjVar5 = info->workspace_coef_arrays;
  switch(info->transform) {
  case JXFORM_NONE:
    uVar28 = info->output_width;
    uVar25 = srcinfo->output_width;
    if (uVar25 < uVar28) {
LAB_0010828c:
      if (info->crop_width_set == JCROP_REFLECT) {
        do_crop_ext_reflect(srcinfo,dstinfo,info->x_crop_offset,info->y_crop_offset,src_coef_arrays,
                            ppjVar5);
        return;
      }
      if ((uVar25 < uVar28) && (info->crop_width_set == JCROP_FORCE)) {
        do_crop_ext_flat(srcinfo,dstinfo,info->x_crop_offset,info->y_crop_offset,src_coef_arrays,
                         ppjVar5);
        return;
      }
    }
    else {
      if (info->output_height <= srcinfo->output_height) {
        if ((info->x_crop_offset == 0) && (info->y_crop_offset == 0)) {
          return;
        }
        do_crop(srcinfo,dstinfo,info->x_crop_offset,info->y_crop_offset,src_coef_arrays,ppjVar5);
        return;
      }
      if (uVar25 < uVar28) goto LAB_0010828c;
    }
    iVar69 = dstinfo->max_h_samp_factor;
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      uVar28 = srcinfo->output_height;
      iVar71 = dstinfo->max_v_samp_factor;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar42 = pjVar8[lVar32].v_samp_factor;
          uVar48 = pjVar8[lVar32].h_samp_factor * (uVar25 / (uint)(iVar69 << 3));
          uVar19 = iVar42 * JVar3;
          uVar51 = pjVar8[lVar32].h_samp_factor * JVar2;
          uVar29 = (ulong)uVar51;
          uVar51 = uVar51 + uVar48;
          uVar24 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],uVar24,
                                   pjVar8[lVar32].v_samp_factor,1);
            if (srcinfo->output_height < dstinfo->image_height) {
              if ((uVar19 <= uVar24) && (uVar24 < iVar42 * (uVar28 / (uint)(iVar71 << 3) + JVar3)))
              {
                pjVar23 = srcinfo->mem;
                pjVar35 = src_coef_arrays[lVar32];
                JVar50 = pjVar8[lVar32].v_samp_factor;
                uVar36 = -uVar19;
                goto LAB_00109e7a;
              }
              if (0 < pjVar8[lVar32].v_samp_factor) {
                lVar31 = 0;
                do {
                  memset(ppaJVar21[lVar31],0,(ulong)pjVar8[lVar32].width_in_blocks << 7);
                  lVar31 = lVar31 + 1;
                } while (lVar31 < pjVar8[lVar32].v_samp_factor);
              }
            }
            else {
              pjVar23 = srcinfo->mem;
              pjVar35 = src_coef_arrays[lVar32];
              JVar50 = pjVar8[lVar32].v_samp_factor;
              uVar36 = uVar19;
LAB_00109e7a:
              ppaJVar22 = (*pjVar23->access_virt_barray)
                                    ((j_common_ptr)srcinfo,pjVar35,uVar24 + uVar36,JVar50,0);
              if (0 < pjVar8[lVar32].v_samp_factor) {
                lVar31 = 0;
                do {
                  if (srcinfo->output_width < dstinfo->image_width) {
                    if (uVar29 != 0) {
                      memset(ppaJVar21[lVar31],0,uVar29 * 0x80);
                    }
                    jcopy_block_row(ppaJVar22[lVar31],ppaJVar21[lVar31] + uVar29,uVar48);
                    uVar36 = pjVar8[lVar32].width_in_blocks - uVar51;
                    if (uVar51 <= pjVar8[lVar32].width_in_blocks && uVar36 != 0) {
                      memset(ppaJVar21[lVar31] + uVar29 + uVar48,0,(ulong)uVar36 << 7);
                    }
                  }
                  else {
                    jcopy_block_row(ppaJVar22[lVar31] + uVar29,ppaJVar21[lVar31],
                                    pjVar8[lVar32].width_in_blocks);
                  }
                  lVar31 = lVar31 + 1;
                } while (lVar31 < pjVar8[lVar32].v_samp_factor);
              }
            }
            uVar24 = uVar24 + pjVar8[lVar32].v_samp_factor;
          } while (uVar24 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_FLIP_H:
    JVar2 = info->y_crop_offset;
    if ((JVar2 == 0) && (info->slow_hflip == 0)) {
      do_flip_h_no_crop(srcinfo,dstinfo,info->x_crop_offset,src_coef_arrays);
      return;
    }
    uVar28 = srcinfo->output_width;
    iVar69 = dstinfo->max_h_samp_factor;
    if (0 < dstinfo->num_components) {
      JVar3 = info->x_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          uVar48 = pjVar8[lVar32].h_samp_factor * (uVar28 / (uint)(iVar69 << 3));
          uVar51 = pjVar8[lVar32].h_samp_factor * JVar3;
          iVar71 = pjVar8[lVar32].v_samp_factor;
          uVar25 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],uVar25,
                                   pjVar8[lVar32].v_samp_factor,1);
            ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],
                                   iVar71 * JVar2 + uVar25,pjVar8[lVar32].v_samp_factor,0);
            iVar42 = pjVar8[lVar32].v_samp_factor;
            if (0 < iVar42) {
              local_f8 = 0;
              do {
                if (pjVar8[lVar32].width_in_blocks != 0) {
                  paJVar26 = ppaJVar21[local_f8];
                  paJVar6 = ppaJVar22[local_f8];
                  uVar29 = 0;
                  do {
                    uVar19 = uVar51 + (int)uVar29;
                    if (uVar19 < uVar48) {
                      pJVar39 = paJVar26[uVar29];
                      pJVar33 = paJVar6[~uVar19 + uVar48];
                      uVar19 = 0xfffffffe;
                      do {
                        *pJVar39 = *pJVar33;
                        pJVar39[1] = -pJVar33[1];
                        pJVar39 = pJVar39 + 2;
                        uVar19 = uVar19 + 2;
                        pJVar33 = pJVar33 + 2;
                      } while (uVar19 < 0x3e);
                    }
                    else {
                      jcopy_block_row(paJVar6 + uVar51 + uVar29,paJVar26 + uVar29,1);
                    }
                    uVar29 = uVar29 + 1;
                  } while (uVar29 < pjVar8[lVar32].width_in_blocks);
                }
                local_f8 = local_f8 + 1;
                iVar42 = pjVar8[lVar32].v_samp_factor;
              } while (local_f8 < iVar42);
            }
            uVar25 = iVar42 + uVar25;
          } while (uVar25 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_FLIP_V:
    uVar28 = srcinfo->output_height;
    iVar69 = dstinfo->max_v_samp_factor;
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar71 = pjVar8[lVar32].v_samp_factor;
          uVar51 = iVar71 * (uVar28 / (uint)(iVar69 << 3));
          uVar29 = (ulong)(pjVar8[lVar32].h_samp_factor * JVar2);
          uVar25 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],uVar25,
                                   pjVar8[lVar32].v_samp_factor,1);
            uVar48 = uVar25 + iVar71 * JVar3;
            JVar50 = (uVar51 - uVar48) - pjVar8[lVar32].v_samp_factor;
            if (uVar51 <= uVar48) {
              JVar50 = uVar48;
            }
            ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],JVar50,
                                   pjVar8[lVar32].v_samp_factor,0);
            uVar19 = pjVar8[lVar32].v_samp_factor;
            uVar34 = (ulong)uVar19;
            if (0 < (int)uVar19) {
              lVar31 = 0;
              do {
                if (uVar48 < uVar51) {
                  uVar19 = pjVar8[lVar32].width_in_blocks;
                  if ((ulong)uVar19 != 0) {
                    paJVar26 = ppaJVar21[lVar31];
                    paJVar6 = ppaJVar22[(int)((int)uVar34 + ~(uint)lVar31)];
                    uVar34 = 0;
                    do {
                      pJVar33 = paJVar26[uVar34];
                      pJVar39 = paJVar6[uVar29 + uVar34];
                      uVar24 = 0;
                      do {
                        lVar45 = 0;
                        lVar46 = 0;
                        do {
                          pJVar33[lVar46] = pJVar39[lVar46];
                          lVar46 = lVar46 + 1;
                          lVar45 = lVar45 + -2;
                        } while ((int)lVar46 != 8);
                        pJVar33 = (JCOEF *)((long)pJVar33 - lVar45);
                        pJVar39 = (JCOEF *)((long)pJVar39 - lVar45);
                        iVar42 = 8;
                        do {
                          sVar17 = *pJVar39;
                          pJVar39 = pJVar39 + 1;
                          *pJVar33 = -sVar17;
                          pJVar33 = pJVar33 + 1;
                          iVar42 = iVar42 + -1;
                        } while (iVar42 != 0);
                        bVar53 = uVar24 < 6;
                        uVar24 = uVar24 + 2;
                      } while (bVar53);
                      uVar34 = uVar34 + 1;
                    } while (uVar34 != uVar19);
                  }
                }
                else {
                  jcopy_block_row(ppaJVar22[lVar31] + uVar29,ppaJVar21[lVar31],
                                  pjVar8[lVar32].width_in_blocks);
                }
                lVar31 = lVar31 + 1;
                uVar19 = pjVar8[lVar32].v_samp_factor;
                uVar34 = (ulong)(int)uVar19;
              } while (lVar31 < (long)uVar34);
            }
            uVar25 = uVar19 + uVar25;
          } while (uVar25 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_TRANSPOSE:
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar69 = pjVar8[lVar32].h_samp_factor;
          iVar71 = pjVar8[lVar32].v_samp_factor;
          JVar50 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],JVar50,
                                   pjVar8[lVar32].v_samp_factor,1);
            iVar42 = pjVar8[lVar32].v_samp_factor;
            if (0 < iVar42) {
              local_98 = iVar71 * JVar3 + JVar50;
              lVar31 = 0;
              do {
                if (pjVar8[lVar32].width_in_blocks != 0) {
                  uVar29 = 0;
                  do {
                    iVar41 = (int)uVar29;
                    ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                          ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],
                                           iVar41 + iVar69 * JVar2,pjVar8[lVar32].h_samp_factor,0);
                    iVar42 = pjVar8[lVar32].h_samp_factor;
                    if (0 < (long)iVar42) {
                      paJVar26 = ppaJVar21[lVar31];
                      lVar45 = 0;
                      do {
                        pJVar33 = paJVar26[uVar29];
                        pJVar39 = ppaJVar22[lVar45][local_98];
                        lVar46 = 0;
                        do {
                          lVar43 = 0;
                          do {
                            pJVar33[lVar43 * 4] = *(JCOEF *)((long)pJVar39 + lVar43);
                            lVar43 = lVar43 + 2;
                          } while (lVar43 != 0x10);
                          lVar46 = lVar46 + 1;
                          pJVar39 = pJVar39 + 8;
                          pJVar33 = pJVar33 + 1;
                        } while (lVar46 != 8);
                        lVar45 = lVar45 + 1;
                        uVar29 = (ulong)((int)uVar29 + 1);
                      } while (lVar45 != iVar42);
                    }
                    uVar28 = iVar42 + iVar41;
                    uVar29 = (ulong)uVar28;
                  } while (uVar28 < pjVar8[lVar32].width_in_blocks);
                }
                lVar31 = lVar31 + 1;
                iVar42 = pjVar8[lVar32].v_samp_factor;
                local_98 = local_98 + 1;
              } while (lVar31 < iVar42);
            }
            JVar50 = JVar50 + iVar42;
          } while (JVar50 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_TRANSVERSE:
    uVar28 = srcinfo->output_width;
    uVar25 = srcinfo->output_height;
    iVar69 = dstinfo->max_h_samp_factor;
    iVar71 = dstinfo->max_v_samp_factor;
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar42 = pjVar8[lVar32].h_samp_factor;
          iVar41 = pjVar8[lVar32].v_samp_factor;
          uVar51 = iVar42 * (uVar25 / (uint)(iVar69 << 3));
          uVar48 = iVar41 * (uVar28 / (uint)(iVar71 << 3));
          JVar50 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],JVar50,
                                   pjVar8[lVar32].v_samp_factor,1);
            iVar27 = pjVar8[lVar32].v_samp_factor;
            if (0 < iVar27) {
              uVar19 = iVar41 * JVar3 + JVar50;
              local_78 = 0;
              local_5c = uVar19;
              do {
                if (pjVar8[lVar32].width_in_blocks != 0) {
                  uVar24 = ~(uVar19 + (int)local_78) + uVar48;
                  uVar29 = 0;
                  do {
                    iVar27 = (int)uVar29;
                    uVar36 = iVar27 + iVar42 * JVar2;
                    JVar4 = (uVar51 - uVar36) - pjVar8[lVar32].h_samp_factor;
                    if (uVar51 <= uVar36) {
                      JVar4 = uVar36;
                    }
                    ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                          ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],JVar4,
                                           pjVar8[lVar32].h_samp_factor,0);
                    iVar1 = pjVar8[lVar32].h_samp_factor;
                    uVar34 = (ulong)iVar1;
                    if (0 < (long)uVar34) {
                      paJVar26 = ppaJVar21[local_78];
                      uVar30 = 0;
                      do {
                        if (uVar19 < uVar48) {
                          if (uVar36 < uVar51) {
                            pJVar33 = paJVar26[uVar29] + 9;
                            pJVar39 = paJVar26[uVar29] + 8;
                            paJVar6 = ppaJVar22[uVar34 + ~uVar30];
                            uVar52 = 0;
                            do {
                              uVar38 = 0xfffffffffffffffe;
                              uVar49 = 0;
                              pJVar44 = pJVar39;
                              do {
                                uVar20 = uVar49 | uVar52 * 8;
                                (*(JBLOCK *)(pJVar44 + -8))[0] = paJVar6[uVar24][uVar20];
                                *pJVar44 = -*(short *)((long)paJVar6[uVar24] + (uVar20 * 2 | 2));
                                uVar49 = uVar49 + 2;
                                uVar38 = uVar38 + 2;
                                pJVar44 = pJVar44 + 0x10;
                              } while (uVar38 < 6);
                              uVar49 = 0xfffffffffffffffe;
                              uVar38 = 0;
                              pJVar44 = pJVar33;
                              do {
                                uVar20 = uVar38 | uVar52 * 8 + 8;
                                pJVar44[-8] = -paJVar6[uVar24][uVar20];
                                *pJVar44 = *(JCOEF *)((long)paJVar6[uVar24] + (uVar20 * 2 | 2));
                                uVar38 = uVar38 + 2;
                                uVar49 = uVar49 + 2;
                                pJVar44 = pJVar44 + 0x10;
                              } while (uVar49 < 6);
                              pJVar39 = pJVar39 + 2;
                              pJVar33 = pJVar33 + 2;
                              bVar53 = uVar52 < 6;
                              uVar52 = uVar52 + 2;
                            } while (bVar53);
                          }
                          else {
                            pJVar33 = paJVar26[uVar29] + 8;
                            paJVar6 = ppaJVar22[uVar30];
                            lVar31 = 0;
                            do {
                              uVar38 = 0xfffffffffffffffe;
                              uVar52 = 0;
                              pJVar39 = pJVar33;
                              do {
                                uVar49 = uVar52 | lVar31 * 8;
                                (*(JBLOCK *)(pJVar39 + -8))[0] = paJVar6[uVar24][uVar49];
                                *pJVar39 = -*(short *)((long)paJVar6[uVar24] + (uVar49 * 2 | 2));
                                uVar52 = uVar52 + 2;
                                uVar38 = uVar38 + 2;
                                pJVar39 = pJVar39 + 0x10;
                              } while (uVar38 < 6);
                              lVar31 = lVar31 + 1;
                              pJVar33 = pJVar33 + 1;
                            } while (lVar31 != 8);
                          }
                        }
                        else {
                          pJVar33 = paJVar26[uVar29];
                          if (uVar36 < uVar51) {
                            pJVar39 = ppaJVar22[uVar34 + ~uVar30][local_5c];
                            uVar52 = 0;
                            do {
                              lVar31 = 0;
                              do {
                                pJVar33[lVar31 * 4] = *(JCOEF *)((long)pJVar39 + lVar31);
                                lVar31 = lVar31 + 2;
                              } while (lVar31 != 0x10);
                              lVar31 = 0x10;
                              do {
                                pJVar33[lVar31 * 4 + -0x3f] = -*(short *)((long)pJVar39 + lVar31);
                                lVar31 = lVar31 + 2;
                              } while (lVar31 != 0x20);
                              pJVar39 = pJVar39 + 0x10;
                              pJVar33 = pJVar33 + 2;
                              bVar53 = uVar52 < 6;
                              uVar52 = uVar52 + 2;
                            } while (bVar53);
                          }
                          else {
                            pJVar39 = ppaJVar22[uVar30][local_5c];
                            lVar31 = 0;
                            do {
                              lVar45 = 0;
                              do {
                                pJVar33[lVar45 * 4] = *(JCOEF *)((long)pJVar39 + lVar45);
                                lVar45 = lVar45 + 2;
                              } while (lVar45 != 0x10);
                              lVar31 = lVar31 + 1;
                              pJVar39 = pJVar39 + 8;
                              pJVar33 = pJVar33 + 1;
                            } while (lVar31 != 8);
                          }
                        }
                        uVar30 = uVar30 + 1;
                        uVar29 = (ulong)((int)uVar29 + 1);
                      } while (uVar30 != uVar34);
                    }
                    uVar36 = iVar1 + iVar27;
                    uVar29 = (ulong)uVar36;
                  } while (uVar36 < pjVar8[lVar32].width_in_blocks);
                }
                local_78 = local_78 + 1;
                iVar27 = pjVar8[lVar32].v_samp_factor;
                local_5c = local_5c + 1;
              } while (local_78 < iVar27);
            }
            JVar50 = JVar50 + iVar27;
          } while (JVar50 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_ROT_90:
    uVar28 = srcinfo->output_height;
    iVar69 = dstinfo->max_h_samp_factor;
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar71 = pjVar8[lVar32].h_samp_factor;
          uVar25 = iVar71 * (uVar28 / (uint)(iVar69 << 3));
          iVar42 = pjVar8[lVar32].v_samp_factor;
          JVar50 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],JVar50,
                                   pjVar8[lVar32].v_samp_factor,1);
            iVar41 = pjVar8[lVar32].v_samp_factor;
            if (0 < iVar41) {
              uVar51 = iVar42 * JVar3 + JVar50;
              local_e8 = 0;
              do {
                if (pjVar8[lVar32].width_in_blocks != 0) {
                  uVar48 = 0;
                  do {
                    uVar19 = uVar48 + iVar71 * JVar2;
                    JVar4 = (uVar25 - uVar19) - pjVar8[lVar32].h_samp_factor;
                    if (uVar25 <= uVar19) {
                      JVar4 = uVar19;
                    }
                    ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                          ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],JVar4,
                                           pjVar8[lVar32].h_samp_factor,0);
                    iVar41 = pjVar8[lVar32].h_samp_factor;
                    uVar29 = (ulong)iVar41;
                    if (0 < (long)uVar29) {
                      paJVar26 = ppaJVar21[local_e8];
                      uVar34 = 0;
                      uVar24 = uVar48;
                      do {
                        pJVar33 = paJVar26[uVar24];
                        if (uVar19 < uVar25) {
                          pJVar39 = ppaJVar22[uVar29 + ~uVar34][uVar51];
                          uVar30 = 0;
                          do {
                            lVar31 = 0;
                            do {
                              pJVar33[lVar31 * 4] = *(JCOEF *)((long)pJVar39 + lVar31);
                              lVar31 = lVar31 + 2;
                            } while (lVar31 != 0x10);
                            lVar31 = 0x10;
                            do {
                              pJVar33[lVar31 * 4 + -0x3f] = -*(short *)((long)pJVar39 + lVar31);
                              lVar31 = lVar31 + 2;
                            } while (lVar31 != 0x20);
                            pJVar39 = pJVar39 + 0x10;
                            pJVar33 = pJVar33 + 2;
                            bVar53 = uVar30 < 6;
                            uVar30 = uVar30 + 2;
                          } while (bVar53);
                        }
                        else {
                          pJVar39 = ppaJVar22[uVar34][uVar51];
                          lVar31 = 0;
                          do {
                            lVar45 = 0;
                            do {
                              pJVar33[lVar45 * 4] = *(JCOEF *)((long)pJVar39 + lVar45);
                              lVar45 = lVar45 + 2;
                            } while (lVar45 != 0x10);
                            lVar31 = lVar31 + 1;
                            pJVar39 = pJVar39 + 8;
                            pJVar33 = pJVar33 + 1;
                          } while (lVar31 != 8);
                        }
                        uVar34 = uVar34 + 1;
                        uVar24 = uVar24 + 1;
                      } while (uVar34 != uVar29);
                    }
                    uVar48 = iVar41 + uVar48;
                  } while (uVar48 < pjVar8[lVar32].width_in_blocks);
                }
                local_e8 = local_e8 + 1;
                iVar41 = pjVar8[lVar32].v_samp_factor;
                uVar51 = uVar51 + 1;
              } while (local_e8 < iVar41);
            }
            JVar50 = JVar50 + iVar41;
          } while (JVar50 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_ROT_180:
    iVar69 = dstinfo->max_h_samp_factor;
    iVar71 = dstinfo->max_v_samp_factor;
    uVar28 = srcinfo->output_width;
    uVar25 = srcinfo->output_height;
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar42 = pjVar8[lVar32].v_samp_factor;
          uVar24 = pjVar8[lVar32].h_samp_factor * (uVar28 / (uint)(iVar69 << 3));
          uVar51 = iVar42 * (uVar25 / (uint)(iVar71 << 3));
          uVar19 = pjVar8[lVar32].h_samp_factor * JVar2;
          uVar48 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],uVar48,
                                   pjVar8[lVar32].v_samp_factor,1);
            uVar36 = iVar42 * JVar3 + uVar48;
            JVar50 = (uVar51 - uVar36) - pjVar8[lVar32].v_samp_factor;
            if (uVar51 <= uVar36) {
              JVar50 = uVar36;
            }
            ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],JVar50,
                                   pjVar8[lVar32].v_samp_factor,0);
            uVar18 = pjVar8[lVar32].v_samp_factor;
            uVar29 = (ulong)uVar18;
            if (0 < (int)uVar18) {
              lVar31 = 0;
              do {
                paJVar26 = ppaJVar21[lVar31];
                if (uVar36 < uVar51) {
                  uVar18 = pjVar8[lVar32].width_in_blocks;
                  if ((ulong)uVar18 != 0) {
                    paJVar6 = ppaJVar22[(int)((int)uVar29 + ~(uint)lVar31)];
                    uVar29 = 0;
                    do {
                      pJVar33 = paJVar26[uVar29];
                      uVar37 = uVar19 + (int)uVar29;
                      if (uVar37 < uVar24) {
                        pJVar39 = paJVar6[~uVar37 + uVar24];
                        uVar37 = 0;
                        do {
                          uVar40 = 0xfffffffe;
                          do {
                            *pJVar33 = *pJVar39;
                            pJVar44 = pJVar39 + 1;
                            pJVar39 = pJVar39 + 2;
                            pJVar33[1] = -*pJVar44;
                            pJVar33 = pJVar33 + 2;
                            uVar40 = uVar40 + 2;
                          } while (uVar40 < 6);
                          uVar40 = 0xfffffffe;
                          do {
                            *pJVar33 = -*pJVar39;
                            pJVar44 = pJVar39 + 1;
                            pJVar39 = pJVar39 + 2;
                            pJVar33[1] = *pJVar44;
                            pJVar33 = pJVar33 + 2;
                            uVar40 = uVar40 + 2;
                          } while (uVar40 < 6);
                          bVar53 = uVar37 < 6;
                          uVar37 = uVar37 + 2;
                        } while (bVar53);
                      }
                      else {
                        pJVar39 = paJVar6[uVar37];
                        uVar37 = 0;
                        do {
                          lVar45 = 0;
                          lVar46 = 0;
                          do {
                            pJVar33[lVar46] = pJVar39[lVar46];
                            lVar46 = lVar46 + 1;
                            lVar45 = lVar45 + -2;
                          } while ((int)lVar46 != 8);
                          pJVar33 = (JCOEF *)((long)pJVar33 - lVar45);
                          pJVar39 = (JCOEF *)((long)pJVar39 - lVar45);
                          iVar41 = 8;
                          do {
                            sVar17 = *pJVar39;
                            pJVar39 = pJVar39 + 1;
                            *pJVar33 = -sVar17;
                            pJVar33 = pJVar33 + 1;
                            iVar41 = iVar41 + -1;
                          } while (iVar41 != 0);
                          bVar53 = uVar37 < 6;
                          uVar37 = uVar37 + 2;
                        } while (bVar53);
                      }
                      uVar29 = uVar29 + 1;
                    } while (uVar29 != uVar18);
                  }
                }
                else if (pjVar8[lVar32].width_in_blocks != 0) {
                  paJVar6 = ppaJVar22[lVar31];
                  uVar29 = 0;
                  do {
                    uVar18 = uVar19 + (int)uVar29;
                    if (uVar18 < uVar24) {
                      pJVar39 = paJVar26[uVar29];
                      pJVar33 = paJVar6[~uVar18 + uVar24];
                      uVar18 = 0xfffffffe;
                      do {
                        *pJVar39 = *pJVar33;
                        pJVar39[1] = -pJVar33[1];
                        pJVar39 = pJVar39 + 2;
                        uVar18 = uVar18 + 2;
                        pJVar33 = pJVar33 + 2;
                      } while (uVar18 < 0x3e);
                    }
                    else {
                      jcopy_block_row(paJVar6 + uVar19 + uVar29,paJVar26 + uVar29,1);
                    }
                    uVar29 = uVar29 + 1;
                  } while (uVar29 < pjVar8[lVar32].width_in_blocks);
                }
                lVar31 = lVar31 + 1;
                uVar18 = pjVar8[lVar32].v_samp_factor;
                uVar29 = (ulong)(int)uVar18;
              } while (lVar31 < (long)uVar29);
            }
            uVar48 = uVar18 + uVar48;
          } while (uVar48 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_ROT_270:
    uVar28 = srcinfo->output_width;
    iVar69 = dstinfo->max_v_samp_factor;
    if (0 < dstinfo->num_components) {
      JVar2 = info->x_crop_offset;
      JVar3 = info->y_crop_offset;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        if (pjVar8[lVar32].height_in_blocks != 0) {
          iVar71 = pjVar8[lVar32].v_samp_factor;
          uVar25 = iVar71 * (uVar28 / (uint)(iVar69 << 3));
          iVar42 = pjVar8[lVar32].h_samp_factor;
          JVar50 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,ppjVar5[lVar32],JVar50,
                                   pjVar8[lVar32].v_samp_factor,1);
            iVar41 = pjVar8[lVar32].v_samp_factor;
            if (0 < iVar41) {
              uVar48 = JVar50 + iVar71 * JVar3;
              local_e0 = 0;
              uVar51 = uVar48;
              do {
                if (pjVar8[lVar32].width_in_blocks != 0) {
                  uVar19 = ~((int)local_e0 + uVar48) + uVar25;
                  uVar29 = 0;
                  do {
                    iVar27 = (int)uVar29;
                    ppaJVar22 = (*srcinfo->mem->access_virt_barray)
                                          ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],
                                           iVar27 + iVar42 * JVar2,pjVar8[lVar32].h_samp_factor,0);
                    iVar41 = pjVar8[lVar32].h_samp_factor;
                    if (0 < (long)iVar41) {
                      paJVar26 = ppaJVar21[local_e0];
                      lVar31 = 0;
                      do {
                        paJVar6 = ppaJVar22[lVar31];
                        if (uVar48 < uVar25) {
                          pJVar33 = paJVar26[uVar29] + 8;
                          lVar45 = 0;
                          do {
                            uVar30 = 0xfffffffffffffffe;
                            uVar34 = 0;
                            pJVar39 = pJVar33;
                            do {
                              uVar52 = uVar34 | lVar45 * 8;
                              (*(JBLOCK *)(pJVar39 + -8))[0] = paJVar6[uVar19][uVar52];
                              *pJVar39 = -*(short *)((long)paJVar6[uVar19] + (uVar52 * 2 | 2));
                              uVar34 = uVar34 + 2;
                              uVar30 = uVar30 + 2;
                              pJVar39 = pJVar39 + 0x10;
                            } while (uVar30 < 6);
                            lVar45 = lVar45 + 1;
                            pJVar33 = pJVar33 + 1;
                          } while (lVar45 != 8);
                        }
                        else {
                          pJVar39 = paJVar26[uVar29];
                          pJVar33 = paJVar6[uVar51];
                          lVar45 = 0;
                          do {
                            lVar46 = 0;
                            do {
                              pJVar39[lVar46 * 4] = *(JCOEF *)((long)pJVar33 + lVar46);
                              lVar46 = lVar46 + 2;
                            } while (lVar46 != 0x10);
                            lVar45 = lVar45 + 1;
                            pJVar33 = pJVar33 + 8;
                            pJVar39 = pJVar39 + 1;
                          } while (lVar45 != 8);
                        }
                        lVar31 = lVar31 + 1;
                        uVar29 = (ulong)((int)uVar29 + 1);
                      } while (lVar31 != iVar41);
                    }
                    uVar24 = iVar41 + iVar27;
                    uVar29 = (ulong)uVar24;
                  } while (uVar24 < pjVar8[lVar32].width_in_blocks);
                }
                local_e0 = local_e0 + 1;
                iVar41 = pjVar8[lVar32].v_samp_factor;
                uVar51 = uVar51 + 1;
              } while (local_e0 < iVar41);
            }
            JVar50 = JVar50 + iVar41;
          } while (JVar50 < pjVar8[lVar32].height_in_blocks);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_WIPE:
    if (((info->crop_width_set == JCROP_REFLECT) && (info->y_crop_offset == 0)) &&
       ((JVar2 = info->drop_height,
        lVar32 = jdiv_round_up((ulong)info->output_height,(long)info->iMCU_sample_height),
        JVar2 == (JDIMENSION)lVar32 &&
        ((JVar2 = info->x_crop_offset, JVar2 == 0 ||
         (JVar3 = info->drop_width,
         lVar32 = jdiv_round_up((ulong)info->output_width,(long)info->iMCU_sample_width),
         JVar2 + JVar3 == (int)lVar32)))))) {
      do_reflect(srcinfo,dstinfo,info->x_crop_offset,src_coef_arrays,info->drop_width,
                 info->drop_height);
      return;
    }
    JVar2 = info->x_crop_offset;
    JVar3 = info->y_crop_offset;
    JVar50 = info->drop_width;
    if (info->crop_width_set == JCROP_FORCE) {
      if (0 < dstinfo->num_components) {
        JVar4 = info->drop_height;
        lVar32 = 0;
        do {
          pjVar8 = dstinfo->comp_info;
          JVar47 = pjVar8[lVar32].v_samp_factor * JVar3;
          uVar28 = pjVar8[lVar32].v_samp_factor * (JVar4 + JVar3);
          if (JVar47 < uVar28) {
            uVar25 = pjVar8[lVar32].h_samp_factor * JVar2;
            uVar51 = pjVar8[lVar32].h_samp_factor * JVar50;
            uVar29 = (ulong)uVar25;
            uVar48 = uVar51 + uVar25;
            uVar34 = (ulong)uVar48;
            lVar31 = (uVar34 - uVar29) + -1;
            auVar54._8_4_ = (int)lVar31;
            auVar54._0_8_ = lVar31;
            auVar54._12_4_ = (int)((ulong)lVar31 >> 0x20);
            auVar54 = auVar54 ^ _DAT_0013e030;
            do {
              ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                    ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],JVar47,
                                     pjVar8[lVar32].v_samp_factor,1);
              iVar69 = pjVar8[lVar32].v_samp_factor;
              if (0 < iVar69) {
                lVar31 = 0;
                do {
                  memset(ppaJVar21[lVar31] + uVar29,0,(ulong)uVar51 << 7);
                  auVar16 = _DAT_0013e030;
                  auVar15 = _DAT_0013e020;
                  auVar14 = _DAT_0013e010;
                  auVar13 = _DAT_0013e000;
                  auVar12 = _DAT_0013dff0;
                  local_98 = auVar54._0_4_;
                  iStack_94 = auVar54._4_4_;
                  iStack_90 = auVar54._8_4_;
                  iStack_8c = auVar54._12_4_;
                  if (uVar25 == 0) {
                    if (uVar48 < pjVar8[lVar32].width_in_blocks) {
                      sVar17 = ppaJVar21[lVar31][uVar34][0];
                      goto LAB_0010999e;
                    }
                  }
                  else {
                    sVar17 = ppaJVar21[lVar31][uVar25 - 1][0];
                    if (uVar48 < pjVar8[lVar32].width_in_blocks) {
                      sVar17 = (short)((uint)((int)ppaJVar21[lVar31][uVar34][0] + (int)sVar17) >> 1)
                      ;
                    }
LAB_0010999e:
                    if (uVar25 < uVar48) {
                      paJVar26 = ppaJVar21[lVar31] + uVar29 + 7;
                      uVar30 = 0;
                      do {
                        auVar64._8_4_ = (int)uVar30;
                        auVar64._0_8_ = uVar30;
                        auVar64._12_4_ = (int)(uVar30 >> 0x20);
                        auVar56 = (auVar64 | auVar15) ^ auVar16;
                        iVar69 = -(uint)((int)local_98 < auVar56._0_4_);
                        auVar57._4_4_ = -(uint)(iStack_94 < auVar56._4_4_);
                        iVar71 = -(uint)(iStack_90 < auVar56._8_4_);
                        auVar57._12_4_ = -(uint)(iStack_8c < auVar56._12_4_);
                        auVar66._4_4_ = iVar69;
                        auVar66._0_4_ = iVar69;
                        auVar66._8_4_ = iVar71;
                        auVar66._12_4_ = iVar71;
                        auVar72 = pshuflw(in_XMM4,auVar66,0xe8);
                        auVar59._4_4_ = -(uint)(auVar56._4_4_ == iStack_94);
                        auVar59._12_4_ = -(uint)(auVar56._12_4_ == iStack_8c);
                        auVar59._0_4_ = auVar59._4_4_;
                        auVar59._8_4_ = auVar59._12_4_;
                        auVar74 = pshuflw(in_XMM5,auVar59,0xe8);
                        auVar57._0_4_ = auVar57._4_4_;
                        auVar57._8_4_ = auVar57._12_4_;
                        auVar73 = pshuflw(auVar72,auVar57,0xe8);
                        auVar56._8_4_ = 0xffffffff;
                        auVar56._0_8_ = 0xffffffffffffffff;
                        auVar56._12_4_ = 0xffffffff;
                        auVar56 = (auVar73 | auVar74 & auVar72) ^ auVar56;
                        auVar56 = packssdw(auVar56,auVar56);
                        if ((auVar56 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          paJVar26[-7][0] = sVar17;
                        }
                        auVar57 = auVar59 & auVar66 | auVar57;
                        auVar56 = packssdw(auVar57,auVar57);
                        auVar73._8_4_ = 0xffffffff;
                        auVar73._0_8_ = 0xffffffffffffffff;
                        auVar73._12_4_ = 0xffffffff;
                        auVar56 = packssdw(auVar56 ^ auVar73,auVar56 ^ auVar73);
                        if ((auVar56._0_4_ >> 0x10 & 1) != 0) {
                          paJVar26[-6][0] = sVar17;
                        }
                        auVar56 = (auVar64 | auVar14) ^ auVar16;
                        iVar69 = -(uint)((int)local_98 < auVar56._0_4_);
                        auVar70._4_4_ = -(uint)(iStack_94 < auVar56._4_4_);
                        iVar71 = -(uint)(iStack_90 < auVar56._8_4_);
                        auVar70._12_4_ = -(uint)(iStack_8c < auVar56._12_4_);
                        auVar58._4_4_ = iVar69;
                        auVar58._0_4_ = iVar69;
                        auVar58._8_4_ = iVar71;
                        auVar58._12_4_ = iVar71;
                        auVar65._4_4_ = -(uint)(auVar56._4_4_ == iStack_94);
                        auVar65._12_4_ = -(uint)(auVar56._12_4_ == iStack_8c);
                        auVar65._0_4_ = auVar65._4_4_;
                        auVar65._8_4_ = auVar65._12_4_;
                        auVar70._0_4_ = auVar70._4_4_;
                        auVar70._8_4_ = auVar70._12_4_;
                        auVar56 = auVar65 & auVar58 | auVar70;
                        auVar56 = packssdw(auVar56,auVar56);
                        auVar9._8_4_ = 0xffffffff;
                        auVar9._0_8_ = 0xffffffffffffffff;
                        auVar9._12_4_ = 0xffffffff;
                        auVar56 = packssdw(auVar56 ^ auVar9,auVar56 ^ auVar9);
                        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          paJVar26[-5][0] = sVar17;
                        }
                        auVar59 = pshufhw(auVar58,auVar58,0x84);
                        auVar66 = pshufhw(auVar65,auVar65,0x84);
                        auVar57 = pshufhw(auVar59,auVar70,0x84);
                        auVar60._8_4_ = 0xffffffff;
                        auVar60._0_8_ = 0xffffffffffffffff;
                        auVar60._12_4_ = 0xffffffff;
                        auVar60 = (auVar57 | auVar66 & auVar59) ^ auVar60;
                        auVar59 = packssdw(auVar60,auVar60);
                        if ((auVar59 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          paJVar26[-4][0] = sVar17;
                        }
                        auVar59 = (auVar64 | auVar13) ^ auVar16;
                        iVar69 = -(uint)((int)local_98 < auVar59._0_4_);
                        auVar62._4_4_ = -(uint)(iStack_94 < auVar59._4_4_);
                        iVar71 = -(uint)(iStack_90 < auVar59._8_4_);
                        auVar62._12_4_ = -(uint)(iStack_8c < auVar59._12_4_);
                        auVar67._4_4_ = iVar69;
                        auVar67._0_4_ = iVar69;
                        auVar67._8_4_ = iVar71;
                        auVar67._12_4_ = iVar71;
                        auVar56 = pshuflw(auVar56,auVar67,0xe8);
                        auVar61._4_4_ = -(uint)(auVar59._4_4_ == iStack_94);
                        auVar61._12_4_ = -(uint)(auVar59._12_4_ == iStack_8c);
                        auVar61._0_4_ = auVar61._4_4_;
                        auVar61._8_4_ = auVar61._12_4_;
                        in_XMM5 = pshuflw(auVar74 & auVar72,auVar61,0xe8);
                        in_XMM5 = in_XMM5 & auVar56;
                        auVar62._0_4_ = auVar62._4_4_;
                        auVar62._8_4_ = auVar62._12_4_;
                        auVar56 = pshuflw(auVar56,auVar62,0xe8);
                        auVar72._8_4_ = 0xffffffff;
                        auVar72._0_8_ = 0xffffffffffffffff;
                        auVar72._12_4_ = 0xffffffff;
                        auVar72 = (auVar56 | in_XMM5) ^ auVar72;
                        in_XMM4 = packssdw(auVar72,auVar72);
                        if ((in_XMM4 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          paJVar26[-3][0] = sVar17;
                        }
                        auVar62 = auVar61 & auVar67 | auVar62;
                        auVar56 = packssdw(auVar62,auVar62);
                        auVar74._8_4_ = 0xffffffff;
                        auVar74._0_8_ = 0xffffffffffffffff;
                        auVar74._12_4_ = 0xffffffff;
                        auVar56 = packssdw(auVar56 ^ auVar74,auVar56 ^ auVar74);
                        if ((auVar56 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          paJVar26[-2][0] = sVar17;
                        }
                        auVar56 = (auVar64 | auVar12) ^ auVar16;
                        iVar69 = -(uint)((int)local_98 < auVar56._0_4_);
                        auVar68._4_4_ = -(uint)(iStack_94 < auVar56._4_4_);
                        iVar71 = -(uint)(iStack_90 < auVar56._8_4_);
                        auVar68._12_4_ = -(uint)(iStack_8c < auVar56._12_4_);
                        auVar63._4_4_ = iVar69;
                        auVar63._0_4_ = iVar69;
                        auVar63._8_4_ = iVar71;
                        auVar63._12_4_ = iVar71;
                        auVar55._4_4_ = -(uint)(auVar56._4_4_ == iStack_94);
                        auVar55._12_4_ = -(uint)(auVar56._12_4_ == iStack_8c);
                        auVar55._0_4_ = auVar55._4_4_;
                        auVar55._8_4_ = auVar55._12_4_;
                        auVar68._0_4_ = auVar68._4_4_;
                        auVar68._8_4_ = auVar68._12_4_;
                        auVar56 = auVar55 & auVar63 | auVar68;
                        auVar56 = packssdw(auVar56,auVar56);
                        auVar10._8_4_ = 0xffffffff;
                        auVar10._0_8_ = 0xffffffffffffffff;
                        auVar10._12_4_ = 0xffffffff;
                        auVar56 = packssdw(auVar56 ^ auVar10,auVar56 ^ auVar10);
                        if ((auVar56 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          paJVar26[-1][0] = sVar17;
                        }
                        auVar64 = pshufhw(auVar63,auVar63,0x84);
                        auVar56 = pshufhw(auVar55,auVar55,0x84);
                        auVar59 = pshufhw(auVar64,auVar68,0x84);
                        auVar11._8_4_ = 0xffffffff;
                        auVar11._0_8_ = 0xffffffffffffffff;
                        auVar11._12_4_ = 0xffffffff;
                        auVar56 = packssdw(auVar56 & auVar64,(auVar59 | auVar56 & auVar64) ^ auVar11
                                          );
                        if ((auVar56 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          (*paJVar26)[0] = sVar17;
                        }
                        uVar30 = uVar30 + 8;
                        paJVar26 = paJVar26 + 8;
                      } while (((uVar34 - uVar29) + 7 & 0xfffffffffffffff8) != uVar30);
                    }
                  }
                  lVar31 = lVar31 + 1;
                  iVar69 = pjVar8[lVar32].v_samp_factor;
                } while (lVar31 < iVar69);
              }
              JVar47 = JVar47 + iVar69;
            } while (JVar47 < uVar28);
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 < dstinfo->num_components);
      }
    }
    else if (0 < dstinfo->num_components) {
      JVar4 = info->drop_height;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        JVar47 = pjVar8[lVar32].v_samp_factor * JVar3;
        uVar28 = pjVar8[lVar32].v_samp_factor * (JVar4 + JVar3);
        if (JVar47 < uVar28) {
          iVar69 = pjVar8[lVar32].h_samp_factor;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],JVar47,
                                   pjVar8[lVar32].v_samp_factor,1);
            iVar71 = pjVar8[lVar32].v_samp_factor;
            if (0 < iVar71) {
              lVar31 = 0;
              do {
                memset(ppaJVar21[lVar31] + iVar69 * JVar2,0,(ulong)(iVar69 * JVar50) << 7);
                lVar31 = lVar31 + 1;
                iVar71 = pjVar8[lVar32].v_samp_factor;
              } while (lVar31 < iVar71);
            }
            JVar47 = JVar47 + iVar71;
          } while (JVar47 < uVar28);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
    break;
  case JXFORM_DROP:
    JVar2 = info->drop_width;
    if (((JVar2 != 0) && (JVar3 = info->drop_height, JVar3 != 0)) && (0 < dstinfo->num_components))
    {
      JVar50 = info->x_crop_offset;
      JVar4 = info->y_crop_offset;
      pjVar7 = info->drop_ptr;
      ppjVar5 = info->drop_coef_arrays;
      lVar32 = 0;
      do {
        pjVar8 = dstinfo->comp_info;
        iVar69 = pjVar8[lVar32].v_samp_factor;
        uVar28 = iVar69 * JVar3;
        if (uVar28 != 0) {
          uVar25 = pjVar8[lVar32].h_samp_factor * JVar2;
          uVar51 = pjVar8[lVar32].h_samp_factor * JVar50;
          JVar47 = 0;
          do {
            ppaJVar21 = (*srcinfo->mem->access_virt_barray)
                                  ((j_common_ptr)srcinfo,src_coef_arrays[lVar32],
                                   iVar69 * JVar4 + JVar47,pjVar8[lVar32].v_samp_factor,1);
            if (lVar32 < pjVar7->num_components) {
              ppaJVar22 = (*pjVar7->mem->access_virt_barray)
                                    ((j_common_ptr)pjVar7,ppjVar5[lVar32],JVar47,
                                     pjVar8[lVar32].v_samp_factor,0);
              if (0 < pjVar8[lVar32].v_samp_factor) {
                lVar31 = 0;
                do {
                  jcopy_block_row(ppaJVar22[lVar31],ppaJVar21[lVar31] + uVar51,uVar25);
                  lVar31 = lVar31 + 1;
                } while (lVar31 < pjVar8[lVar32].v_samp_factor);
              }
            }
            else if (0 < pjVar8[lVar32].v_samp_factor) {
              lVar31 = 0;
              do {
                memset(ppaJVar21[lVar31] + uVar51,0,(ulong)uVar25 << 7);
                lVar31 = lVar31 + 1;
              } while (lVar31 < pjVar8[lVar32].v_samp_factor);
            }
            JVar47 = JVar47 + pjVar8[lVar32].v_samp_factor;
          } while (JVar47 < uVar28);
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < dstinfo->num_components);
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jtransform_execute_transform(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                             jvirt_barray_ptr *src_coef_arrays,
                             jpeg_transform_info *info)
{
  jvirt_barray_ptr *dst_coef_arrays = info->workspace_coef_arrays;

  /* Note: conditions tested here should match those in switch statement
   * in jtransform_request_workspace()
   */
  switch (info->transform) {
  case JXFORM_NONE:
    if (info->output_width > srcinfo->output_width ||
        info->output_height > srcinfo->output_height) {
      if (info->output_width > srcinfo->output_width &&
          info->crop_width_set == JCROP_REFLECT)
        do_crop_ext_reflect(srcinfo, dstinfo,
                            info->x_crop_offset, info->y_crop_offset,
                            src_coef_arrays, dst_coef_arrays);
      else if (info->output_width > srcinfo->output_width &&
               info->crop_width_set == JCROP_FORCE)
        do_crop_ext_flat(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
      else
        do_crop_ext_zero(srcinfo, dstinfo,
                         info->x_crop_offset, info->y_crop_offset,
                         src_coef_arrays, dst_coef_arrays);
    } else if (info->x_crop_offset != 0 || info->y_crop_offset != 0)
      do_crop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_FLIP_H:
    if (info->y_crop_offset != 0 || info->slow_hflip)
      do_flip_h(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                src_coef_arrays, dst_coef_arrays);
    else
      do_flip_h_no_crop(srcinfo, dstinfo, info->x_crop_offset,
                        src_coef_arrays);
    break;
  case JXFORM_FLIP_V:
    do_flip_v(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSPOSE:
    do_transpose(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_TRANSVERSE:
    do_transverse(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                  src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_90:
    do_rot_90(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_180:
    do_rot_180(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_ROT_270:
    do_rot_270(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
               src_coef_arrays, dst_coef_arrays);
    break;
  case JXFORM_WIPE:
    if (info->crop_width_set == JCROP_REFLECT &&
        info->y_crop_offset == 0 && info->drop_height ==
        (JDIMENSION)jdiv_round_up
          ((long)info->output_height, (long)info->iMCU_sample_height) &&
        (info->x_crop_offset == 0 ||
         info->x_crop_offset + info->drop_width ==
         (JDIMENSION)jdiv_round_up
           ((long)info->output_width, (long)info->iMCU_sample_width)))
      do_reflect(srcinfo, dstinfo, info->x_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else if (info->crop_width_set == JCROP_FORCE)
      do_flatten(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
                 src_coef_arrays, info->drop_width, info->drop_height);
    else
      do_wipe(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_width, info->drop_height);
    break;
  case JXFORM_DROP:
    if (info->drop_width != 0 && info->drop_height != 0)
      do_drop(srcinfo, dstinfo, info->x_crop_offset, info->y_crop_offset,
              src_coef_arrays, info->drop_ptr, info->drop_coef_arrays,
              info->drop_width, info->drop_height);
    break;
  }
}